

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::FieldDescriptorProto::MergePartialFromCodedStream
          (FieldDescriptorProto *this,CodedInputStream *input)

{
  UnknownFieldSet *unknown_fields;
  uint8 *puVar1;
  bool bVar2;
  uint uVar3;
  string *psVar4;
  FieldOptions *value;
  uint32 tag;
  uint32 temp_1;
  uint32 temp;
  uint32 temp_2;
  
  unknown_fields = &this->_unknown_fields_;
LAB_001f3116:
  do {
    puVar1 = input->buffer_;
    if ((puVar1 < input->buffer_end_) && (tag = (uint32)(char)*puVar1, -1 < (char)*puVar1)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar1 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar3 = tag & 7;
    switch(tag >> 3) {
    case 1:
      if (uVar3 == 2) {
        psVar4 = mutable_name_abi_cxx11_(this);
        bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
        if (!bVar2) {
          return false;
        }
        internal::WireFormat::VerifyUTF8StringFallback
                  ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
        puVar1 = input->buffer_;
        if ((puVar1 < input->buffer_end_) && (*puVar1 == '\x12')) {
          input->buffer_ = puVar1 + 1;
LAB_001f31fa:
          psVar4 = mutable_extendee_abi_cxx11_(this);
          bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
          if (!bVar2) {
            return false;
          }
          internal::WireFormat::VerifyUTF8StringFallback
                    ((this->extendee_->_M_dataplus)._M_p,(int)this->extendee_->_M_string_length,
                     PARSE);
          puVar1 = input->buffer_;
          if ((puVar1 < input->buffer_end_) && (*puVar1 == '\x18')) {
            input->buffer_ = puVar1 + 1;
LAB_001f3244:
            bVar2 = io::CodedInputStream::ReadVarint32(input,&temp_1);
            if (!bVar2) {
              return false;
            }
            this->number_ = temp_1;
            *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
            puVar1 = input->buffer_;
            if ((puVar1 < input->buffer_end_) && (*puVar1 == ' ')) {
              input->buffer_ = puVar1 + 1;
LAB_001f3284:
              bVar2 = io::CodedInputStream::ReadVarint32(input,&temp_2);
              if (!bVar2) {
                return false;
              }
              if (temp_2 - 1 < 3) {
                set_label(this,temp_2);
              }
              else {
                UnknownFieldSet::AddVarint(unknown_fields,4,(long)(int)temp_2);
              }
              puVar1 = input->buffer_;
              if ((puVar1 < input->buffer_end_) && (*puVar1 == '(')) {
                input->buffer_ = puVar1 + 1;
LAB_001f330f:
                bVar2 = io::CodedInputStream::ReadVarint32(input,&temp);
                if (!bVar2) {
                  return false;
                }
                if (temp - 1 < 0x12) {
                  set_type(this,temp);
                }
                else {
                  UnknownFieldSet::AddVarint(unknown_fields,5,(long)(int)temp);
                }
                puVar1 = input->buffer_;
                if ((puVar1 < input->buffer_end_) && (*puVar1 == '2')) {
                  input->buffer_ = puVar1 + 1;
LAB_001f3364:
                  psVar4 = mutable_type_name_abi_cxx11_(this);
                  bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
                  if (!bVar2) {
                    return false;
                  }
                  internal::WireFormat::VerifyUTF8StringFallback
                            ((this->type_name_->_M_dataplus)._M_p,
                             (int)this->type_name_->_M_string_length,PARSE);
                  puVar1 = input->buffer_;
                  if ((puVar1 < input->buffer_end_) && (*puVar1 == ':')) {
                    input->buffer_ = puVar1 + 1;
LAB_001f33ae:
                    psVar4 = mutable_default_value_abi_cxx11_(this);
                    bVar2 = internal::WireFormatLite::ReadString(input,psVar4);
                    if (!bVar2) {
                      return false;
                    }
                    internal::WireFormat::VerifyUTF8StringFallback
                              ((this->default_value_->_M_dataplus)._M_p,
                               (int)this->default_value_->_M_string_length,PARSE);
                    puVar1 = input->buffer_;
                    if ((puVar1 < input->buffer_end_) && (*puVar1 == 'B')) {
                      input->buffer_ = puVar1 + 1;
LAB_001f33f4:
                      value = mutable_options(this);
                      bVar2 = internal::WireFormatLite::
                              ReadMessageNoVirtual<google::protobuf::FieldOptions>(input,value);
                      if (!bVar2) {
                        return false;
                      }
                      bVar2 = io::CodedInputStream::ExpectAtEnd(input);
                      if (bVar2) {
                        return true;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_001f3116;
      }
      break;
    case 2:
      if (uVar3 == 2) goto LAB_001f31fa;
      break;
    case 3:
      if (uVar3 == 0) goto LAB_001f3244;
      break;
    case 4:
      if (uVar3 == 0) goto LAB_001f3284;
      break;
    case 5:
      if (uVar3 == 0) goto LAB_001f330f;
      break;
    case 6:
      if (uVar3 == 2) goto LAB_001f3364;
      break;
    case 7:
      if (uVar3 == 2) goto LAB_001f33ae;
      break;
    case 8:
      if (uVar3 == 2) goto LAB_001f33f4;
    }
    if (uVar3 == 4) {
      return true;
    }
    bVar2 = internal::WireFormat::SkipField(input,tag,unknown_fields);
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool FieldDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_extendee;
        break;
      }

      // optional string extendee = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extendee:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_extendee()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->extendee().data(), this->extendee().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(24)) goto parse_number;
        break;
      }

      // optional int32 number = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_number:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &number_)));
          set_has_number();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(32)) goto parse_label;
        break;
      }

      // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_label:
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldDescriptorProto_Label_IsValid(value)) {
            set_label(static_cast< ::google::protobuf::FieldDescriptorProto_Label >(value));
          } else {
            mutable_unknown_fields()->AddVarint(4, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(40)) goto parse_type;
        break;
      }

      // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_type:
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldDescriptorProto_Type_IsValid(value)) {
            set_type(static_cast< ::google::protobuf::FieldDescriptorProto_Type >(value));
          } else {
            mutable_unknown_fields()->AddVarint(5, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(50)) goto parse_type_name;
        break;
      }

      // optional string type_name = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_type_name:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_type_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->type_name().data(), this->type_name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(58)) goto parse_default_value;
        break;
      }

      // optional string default_value = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_default_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_default_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->default_value().data(), this->default_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(66)) goto parse_options;
        break;
      }

      // optional .google.protobuf.FieldOptions options = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}